

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::tracker_announce_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,tracker_announce_alert *this)

{
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  tracker_announce_alert *local_18;
  tracker_announce_alert *this_local;
  
  local_18 = this;
  this_local = (tracker_announce_alert *)__return_storage_ptr__;
  tracker_alert::message_abi_cxx11_(&local_78,&this->super_tracker_alert);
  ::std::operator+(&local_58,&local_78," sending announce (");
  ::std::operator+(&local_38,&local_58,
                   message::event_str[(byte)(this->super_tracker_alert).field_0x4d]);
  ::std::operator+(__return_storage_ptr__,&local_38,")");
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string tracker_announce_alert::message() const
	{
#ifdef TORRENT_DISABLE_ALERT_MSG
		return {};
#else
		static const char* const event_str[] = {"none", "completed", "started", "stopped", "paused"};
		return tracker_alert::message()
			+ " sending announce (" + event_str[static_cast<int>(event)] + ")";
#endif
	}